

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmap.cpp
# Opt level: O0

int __thiscall QPixmap::copy(QPixmap *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  bool bVar1;
  int iVar2;
  QPlatformPixmap *pQVar3;
  QPixmap *this_00;
  long in_FS_OFFSET;
  QRect QVar4;
  QPlatformPixmap *d;
  QRect r;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  QPixmap *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  undefined4 extraout_var;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = isNull(in_stack_ffffffffffffff90);
  if (bVar1) {
    QPixmap(in_stack_ffffffffffffff90);
  }
  else {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    iVar2 = width(in_stack_ffffffffffffff90);
    height(in_stack_ffffffffffffff90);
    QRect::QRect((QRect *)CONCAT44(iVar2,in_stack_ffffffffffffff98),
                 (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),(int)in_stack_ffffffffffffff90,
                 in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    bVar1 = QRect::isEmpty((QRect *)in_stack_ffffffffffffff90);
    if (!bVar1) {
      QVar4 = QRect::intersected((QRect *)in_stack_ffffffffffffff90,
                                 (QRect *)CONCAT44(in_stack_ffffffffffffff8c,
                                                   in_stack_ffffffffffffff88));
      local_28 = QVar4._0_8_;
      local_18 = local_28;
      local_20 = QVar4._8_8_;
      local_10 = local_20;
    }
    pQVar3 = QExplicitlySharedDataPointer<QPlatformPixmap>::operator->
                       ((QExplicitlySharedDataPointer<QPlatformPixmap> *)0x320a64);
    iVar2 = (*pQVar3->_vptr_QPlatformPixmap[2])();
    this_00 = (QPixmap *)CONCAT44(extraout_var,iVar2);
    pQVar3 = QExplicitlySharedDataPointer<QPlatformPixmap>::data
                       ((QExplicitlySharedDataPointer<QPlatformPixmap> *)0x320a8a);
    (*(this_00->super_QPaintDevice)._vptr_QPaintDevice[9])(this_00,pQVar3,&local_18);
    QPixmap(this_00,(QPlatformPixmap *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
           );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)this;
  }
  __stack_chk_fail();
}

Assistant:

QPixmap QPixmap::copy(const QRect &rect) const
{
    if (isNull())
        return QPixmap();

    QRect r(0, 0, width(), height());
    if (!rect.isEmpty())
        r = r.intersected(rect);

    QPlatformPixmap *d = data->createCompatiblePlatformPixmap();
    d->copy(data.data(), r);
    return QPixmap(d);
}